

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_complex_sub(sexp ctx,sexp a,sexp b)

{
  sexp_gc_var_t *psVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_gc_var_t local_48;
  sexp psVar7;
  sexp_tag_t local_20;
  char cStack_1c;
  undefined3 uStack_1b;
  undefined8 local_8;
  
  local_20 = 0x43e;
  cStack_1c = '\0';
  uStack_1b = 0;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffd0,0,0x10);
  psVar7 = (sexp)&DAT_0000043e;
  memset(&local_48,0,0x10);
  psVar1 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffd0;
  local_48.var = (sexp_conflict *)&stack0xffffffffffffffc8;
  local_48.next = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = &local_48;
  psVar7 = sexp_complex_copy((sexp)&stack0xffffffffffffffe0,psVar7);
  if ((((psVar7->value).stack.length & 3) == 0) && (((psVar7->value).type.name)->tag == 0xd)) {
    if ((((((psVar7->value).type.name)->value).stack.length & 3) == 0) &&
       (((((psVar7->value).type.name)->value).type.name)->tag == 0xc)) {
      (((((psVar7->value).type.name)->value).type.name)->value).flonum_bits[0] =
           -(((((psVar7->value).type.name)->value).type.name)->value).flonum_bits[0];
    }
    else if (((((psVar7->value).type.name)->value).stack.length & 1) == 1) {
      uVar2 = (((psVar7->value).type.name)->value).stack.length;
      auVar3._8_8_ = (long)uVar2 >> 0x3f;
      auVar3._0_8_ = uVar2 & 0xfffffffffffffffe;
      (((psVar7->value).type.name)->value).stack.length = SUB168(auVar3 / SEXT816(2),0) * -2 | 1;
    }
  }
  else if ((((psVar7->value).stack.length & 3) == 0) && (((psVar7->value).type.name)->tag == 0xb)) {
    (((psVar7->value).type.name)->value).stack.length =
         (((psVar7->value).type.name)->value).stack.length ^ 0x8000000000000000;
  }
  else if ((((psVar7->value).stack.length & 3) == 0) && (((psVar7->value).type.name)->tag == 0xc)) {
    (((psVar7->value).type.name)->value).flonum_bits[0] =
         -(((psVar7->value).type.name)->value).flonum_bits[0];
  }
  else if (((psVar7->value).stack.length & 1) == 1) {
    uVar2 = (psVar7->value).stack.length;
    auVar4._8_8_ = (long)uVar2 >> 0x3f;
    auVar4._0_8_ = uVar2 & 0xfffffffffffffffe;
    (psVar7->value).stack.length = SUB168(auVar4 / SEXT816(2),0) * -2 | 1;
  }
  if ((((psVar7->value).string.offset & 3) == 0) && (((psVar7->value).type.cpl)->tag == 0xd)) {
    if ((((((psVar7->value).type.cpl)->value).stack.length & 3) == 0) &&
       (((((psVar7->value).type.cpl)->value).type.name)->tag == 0xc)) {
      (((((psVar7->value).type.cpl)->value).type.name)->value).flonum_bits[0] =
           -(((((psVar7->value).type.cpl)->value).type.name)->value).flonum_bits[0];
    }
    else if (((((psVar7->value).type.cpl)->value).stack.length & 1) == 1) {
      uVar2 = (((psVar7->value).type.cpl)->value).stack.length;
      auVar5._8_8_ = (long)uVar2 >> 0x3f;
      auVar5._0_8_ = uVar2 & 0xfffffffffffffffe;
      (((psVar7->value).type.cpl)->value).stack.length = SUB168(auVar5 / SEXT816(2),0) * -2 | 1;
    }
  }
  else if ((((psVar7->value).string.offset & 3) == 0) && (((psVar7->value).type.cpl)->tag == 0xb)) {
    (((psVar7->value).type.cpl)->value).stack.length =
         (((psVar7->value).type.cpl)->value).stack.length ^ 0x8000000000000000;
  }
  else if ((((psVar7->value).string.offset & 3) == 0) && (((psVar7->value).type.cpl)->tag == 0xc)) {
    (((psVar7->value).type.cpl)->value).flonum_bits[0] =
         -(((psVar7->value).type.cpl)->value).flonum_bits[0];
  }
  else if (((psVar7->value).string.offset & 1) == 1) {
    uVar2 = (psVar7->value).fileno.fd;
    auVar6._8_8_ = (long)uVar2 >> 0x3f;
    auVar6._0_8_ = uVar2 & 0xfffffffffffffffe;
    (psVar7->value).string.offset = SUB168(auVar6 / SEXT816(2),0) * -2 | 1;
  }
  psVar7 = sexp_complex_add(tmp,(sexp)__sexp_gc_preserver2.next,(sexp)__sexp_gc_preserver2.var);
  (((sexp)local_8)->value).context.saves = psVar1;
  return psVar7;
}

Assistant:

sexp sexp_complex_sub (sexp ctx, sexp a, sexp b) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  tmp = sexp_complex_copy(ctx, b);
  sexp_negate_maybe_ratio(sexp_complex_real(tmp));
  sexp_negate_maybe_ratio(sexp_complex_imag(tmp));
  res = sexp_complex_add(ctx, a, tmp);
  sexp_gc_release2(ctx);
  return res;
}